

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Abc_Cex_t *
Saig_ManFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fNewOrder,int fVerbose)

{
  abctime aVar1;
  Saig_RefMan_t *p;
  Vec_Int_t *vReasons;
  Vec_Int_t *p_00;
  abctime aVar2;
  Abc_Cex_t *p_01;
  int level;
  
  Abc_Clock();
  aVar1 = Abc_Clock();
  p = Saig_RefManStart(pAig,pCex,nInputs,fVerbose);
  vReasons = Saig_RefManFindReason(p);
  if (fVerbose != 0) {
    Aig_ManPrintStats(p->pFrames);
  }
  p_00 = Saig_RefManReason2Inputs(p,vReasons);
  level = 0x833e59;
  printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
         (ulong)(uint)p->pFrames->nObjs[2],(ulong)(uint)vReasons->nSize,
         (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)(uint)p_00->nSize);
  Abc_Print(level,"%s =","Time");
  aVar2 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  Vec_IntFree(p_00);
  p_01 = Saig_RefManReason2Cex(p,vReasons);
  Vec_IntFree(vReasons);
  Saig_RefManStop(p);
  if (fVerbose != 0) {
    Abc_CexPrintStats(pCex);
    Abc_CexPrintStats(p_01);
  }
  return p_01;
}

Assistant:

Abc_Cex_t * Saig_ManFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fNewOrder, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_RefManStart( pAig, pCex, nInputs, fVerbose );
    vReasons = Saig_RefManFindReason( p );

if ( fVerbose )
Aig_ManPrintStats( p->pFrames );

//    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );

        Vec_IntFree( vRes );

/*
        ////////////////////////////////////
        Vec_IntFree( vReasons );
        vReasons = Saig_RefManRefineWithSat( p, vRes );
        ////////////////////////////////////

        Vec_IntFree( vRes );
        vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );

        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
*/
    }

    pCare = Saig_RefManReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_RefManStop( p );

if ( fVerbose )
Abc_CexPrintStats( pCex );
if ( fVerbose )
Abc_CexPrintStats( pCare );

    return pCare;
}